

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bucket.h
# Opt level: O0

bool __thiscall dg::vr::Bucket::EdgeIterator::isViable(EdgeIterator *this)

{
  bool bVar1;
  key_type *__x;
  reference pvVar2;
  iterator this_00;
  RelationEdge *this_01;
  set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
  *in_RDI;
  undefined4 in_stack_ffffffffffffffc8;
  Type in_stack_ffffffffffffffcc;
  bool local_19;
  _Self local_10 [2];
  
  __x = (key_type *)
        std::
        reference_wrapper<std::set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>_>
        ::get((reference_wrapper<std::set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>_>
               *)&(in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_node_count);
  pvVar2 = std::
           vector<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
           ::back((vector<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                   *)__x);
  DirectRelIterator::operator*(pvVar2);
  local_10[0]._M_node =
       (_Base_ptr)
       std::
       set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
       ::find(in_RDI,__x);
  std::
  reference_wrapper<std::set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>_>
  ::get((reference_wrapper<std::set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>_>
         *)&(in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_node_count);
  this_00 = std::
            set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
            ::end((set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
                   *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  bVar1 = std::operator==(local_10,(_Self *)&stack0xffffffffffffffe8);
  local_19 = false;
  if (bVar1) {
    pvVar2 = std::
             vector<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
             ::back((vector<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                     *)__x);
    this_01 = DirectRelIterator::operator->(pvVar2);
    RelationEdge::rel(this_01);
    bVar1 = Relations::has((Relations *)__x,in_stack_ffffffffffffffcc);
    local_19 = false;
    if ((bVar1) &&
       (local_19 = true,
       ((in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color & 0x100) != _S_red)) {
      local_19 = shouldFollowThrough((EdgeIterator *)this_00._M_node);
    }
  }
  return local_19;
}

Assistant:

bool isViable() {
            return visited.get().find(*stack.back()) == visited.get().end() &&
                   allowedEdges.has(stack.back()->rel()) &&
                   (!relationsFocused || shouldFollowThrough());
        }